

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

ostream * soplex::operator<<(ostream *os,
                            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *v)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  bool bVar2;
  type_conflict5 tVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  long lVar9;
  byte bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar10 = 0;
  bVar2 = true;
  lVar6 = 0;
  for (lVar9 = 0; lVar9 < v->memused; lVar9 = lVar9 + 1) {
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)(v->m_elem->val).m_backend.data._M_elems + lVar6);
    poVar4 = os;
    if (!bVar2) {
      local_b0.m_backend.data._M_elems[0] = 0;
      tVar3 = boost::multiprecision::operator<(pnVar8,(int *)&local_b0);
      if (tVar3) {
        poVar4 = std::operator<<(os," - ");
        pNVar1 = v->m_elem;
        puVar7 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar6);
        pnVar8 = &local_b0;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = *puVar7;
          puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6);
        local_b0.m_backend.neg = *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6 + 4);
        local_b0.m_backend._120_8_ =
             *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6 + 8);
        pnVar8 = &local_b0;
        if (local_b0.m_backend.fpclass != cpp_dec_float_finite ||
            local_b0.m_backend.data._M_elems[0] != 0) {
          local_b0.m_backend.neg = (bool)(local_b0.m_backend.neg ^ 1);
        }
      }
      else {
        poVar4 = std::operator<<(os," + ");
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)(v->m_elem->val).m_backend.data._M_elems + lVar6);
      }
    }
    boost::multiprecision::operator<<(poVar4,pnVar8);
    poVar4 = std::operator<<(os," x");
    std::ostream::operator<<((ostream *)poVar4,*(int *)((long)(&v->m_elem->val + 1) + lVar6));
    if (((int)lVar9 + 1U & 3) == 0) {
      std::operator<<(os,"\n\t");
    }
    lVar6 = lVar6 + 0x84;
    bVar2 = false;
  }
  return os;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}